

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O3

void __thiscall
tt::net::EventLoop::updatePoller(EventLoop *this,shared_ptr<tt::net::Channel> *channel,int timeout)

{
  Epoll *this_00;
  SP_Channel local_20;
  
  this_00 = (this->m_epoll).super___shared_ptr<tt::net::Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (channel->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (channel->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  Epoll::epoll_mod(this_00,&local_20,timeout);
  if (local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void EventLoop::updatePoller(std::shared_ptr<Channel> channel, int timeout){ 
		m_epoll->epoll_mod(channel, timeout); 
}